

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator-
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *__return_storage_ptr__
          ,LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value)

{
  KFIXED<short,_(unsigned_char)__x03_> local_c8;
  KFIXED<short,_(unsigned_char)__x03_> local_b8;
  KFIXED<short,_(unsigned_char)__x03_> local_a8;
  KFIXED<short,_(unsigned_char)__x03_> local_98;
  KFIXED<short,_(unsigned_char)__x03_> local_88;
  KFIXED<short,_(unsigned_char)__x03_> local_78 [2];
  KFIXED<short,_(unsigned_char)__x03_> local_58;
  KFIXED<short,_(unsigned_char)__x03_> local_48;
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  undefined1 local_21;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *local_20;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *tmp;
  
  local_21 = 0;
  local_20 = Value;
  Value_local = this;
  this_local = __return_storage_ptr__;
  LE_Vector(__return_storage_ptr__,this);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_58,&local_20->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::operator-(&local_48,&__return_storage_ptr__->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_38,&__return_storage_ptr__->m_X);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_58);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_98,&local_20->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::operator-(&local_88,&__return_storage_ptr__->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(local_78,&__return_storage_ptr__->m_Y);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(local_78);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_c8,&local_20->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::operator-(&local_b8,&__return_storage_ptr__->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_a8,&__return_storage_ptr__->m_Z);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_a8);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_b8);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

LE_Vector<Type> LE_Vector<Type>::operator - ( const LE_Vector & Value ) const
{
    LE_Vector tmp = *this;
    tmp.m_X = tmp.m_X - Value.m_X;
    tmp.m_Y = tmp.m_Y - Value.m_Y;
    tmp.m_Z = tmp.m_Z - Value.m_Z;
    return tmp;
}